

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::LazyStringOutputStream::Next
          (LazyStringOutputStream *this,void **data,int *size)

{
  bool bVar1;
  ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *pRVar2;
  string *psVar3;
  
  if (this->string_is_set_ == false) {
    pRVar2 = internal::
             scoped_ptr<google::protobuf::ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::operator->(&this->callback_);
    psVar3 = (string *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2);
    (this->super_StringOutputStream).target_ = psVar3;
    this->string_is_set_ = true;
  }
  bVar1 = StringOutputStream::Next(&this->super_StringOutputStream,data,size);
  return bVar1;
}

Assistant:

bool LazyStringOutputStream::Next(void** data, int* size) {
  if (!string_is_set_) {
    SetString(callback_->Run());
    string_is_set_ = true;
  }
  return StringOutputStream::Next(data, size);
}